

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::merkle_tree::load_tree
          (merkle_tree *this,span<const_libtorrent::digest32<256L>_> t,bitfield *verified)

{
  bool bVar1;
  digest32<256L> *n;
  size_t sVar2;
  size_t sVar3;
  index_type iVar4;
  sha256_hash local_88;
  span<libtorrent::digest32<256L>_> local_68;
  span<const_libtorrent::digest32<256L>_> local_58;
  sha256_hash local_48;
  bitfield *local_28;
  bitfield *verified_local;
  merkle_tree *this_local;
  span<const_libtorrent::digest32<256L>_> t_local;
  
  t_local.m_ptr = (digest32<256L> *)t.m_len;
  this_local = (merkle_tree *)t.m_ptr;
  local_28 = verified;
  verified_local = (bitfield *)this;
  bVar1 = span<const_libtorrent::digest32<256L>_>::empty
                    ((span<const_libtorrent::digest32<256L>_> *)&this_local);
  if (!bVar1) {
    root(&local_48,this);
    n = span<const_libtorrent::digest32<256L>_>::operator[]
                  ((span<const_libtorrent::digest32<256L>_> *)&this_local,0);
    bVar1 = digest32<256L>::operator!=(&local_48,n);
    if (!bVar1) {
      sVar2 = size(this);
      sVar3 = span<const_libtorrent::digest32<256L>_>::size
                        ((span<const_libtorrent::digest32<256L>_> *)&this_local);
      if (sVar2 == sVar3) {
        iVar4 = span<const_libtorrent::digest32<256L>_>::size
                          ((span<const_libtorrent::digest32<256L>_> *)&this_local);
        if (iVar4 == 1) {
          optimize_storage(this);
        }
        else {
          allocate_full(this);
          span<libtorrent::digest32<256l>const>::
          span<libtorrent::span<libtorrent::digest32<256l>const>,libtorrent::digest32<256l>const,void>
                    ((span<libtorrent::digest32<256l>const> *)&local_58,
                     (span<const_libtorrent::digest32<256L>_> *)&this_local);
          span<libtorrent::digest32<256l>>::
          span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
                    ((span<libtorrent::digest32<256l>> *)&local_68,&this->m_tree);
          root(&local_88,this);
          merkle_validate_copy(local_58,local_68,&local_88,&this->m_block_verified);
          load_verified_bits(this,local_28);
          optimize_storage(this);
          optimize_storage_piece_layer(this);
        }
      }
    }
  }
  return;
}

Assistant:

void merkle_tree::load_tree(span<sha256_hash const> t, bitfield const& verified)
	{
		INVARIANT_CHECK;
		if (t.empty()) return;
		if (root() != t[0]) return;
		if (size() != static_cast<std::size_t>(t.size())) return;

		if (t.size() == 1)
		{
			// don't fully allocate a tree of 1 node. It's just the root and we
			// have a special case representation for this
			optimize_storage();
			return;
		}

		allocate_full();

		merkle_validate_copy(t, m_tree, root(), m_block_verified);

		load_verified_bits(verified);

		optimize_storage();
		optimize_storage_piece_layer();
	}